

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O1

Vec_Int_t * Gia_ObjSimCands(Gia_SimRsbMan_t *p,int iObj,int nCands)

{
  Vec_Int_t *pVVar1;
  Gia_Man_t *pGVar2;
  Vec_Int_t *pVVar3;
  uint uVar4;
  int *piVar5;
  int iVar6;
  long lVar7;
  
  if (iObj < 1) {
    __assert_fail("iObj > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                  ,0x239,"Vec_Int_t *Gia_ObjSimCands(Gia_SimRsbMan_t *, int, int)");
  }
  if (p->pGia->nObjs <= iObj) {
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
  uVar4 = (uint)*(undefined8 *)(p->pGia->pObjs + (uint)iObj);
  if (((int)uVar4 < 0) || ((uVar4 & 0x1fffffff) == 0x1fffffff)) {
    __assert_fail("Gia_ObjIsAnd(Gia_ManObj(p->pGia, iObj))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                  ,0x23a,"Vec_Int_t *Gia_ObjSimCands(Gia_SimRsbMan_t *, int, int)");
  }
  p->vCands->nSize = 0;
  pVVar1 = p->vFanins;
  if (pVVar1->nCap < 1) {
    if (pVVar1->pArray == (int *)0x0) {
      piVar5 = (int *)malloc(4);
    }
    else {
      piVar5 = (int *)realloc(pVVar1->pArray,4);
    }
    pVVar1->pArray = piVar5;
    if (piVar5 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    pVVar1->nCap = 1;
  }
  *pVVar1->pArray = iObj;
  pVVar1->nSize = 1;
  pVVar1 = p->vFanins;
  iVar6 = pVVar1->nSize;
  do {
    if (iVar6 < 1) {
LAB_007b91da:
      if ((iVar6 != 0) && (p->vCands->nSize < nCands)) {
        __assert_fail("Vec_IntSize(p->vFanins) == 0 || Vec_IntSize(p->vCands) >= nCands",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                      ,0x246,"Vec_Int_t *Gia_ObjSimCands(Gia_SimRsbMan_t *, int, int)");
      }
      pVVar1 = p->vCands;
      if (nCands < pVVar1->nSize) {
        pVVar1->nSize = nCands;
      }
      return pVVar1;
    }
    if (nCands <= p->vCands->nSize) {
      iVar6 = 1;
      goto LAB_007b91da;
    }
    if (0 < pVVar1->nSize) {
      piVar5 = pVVar1->pArray;
      pGVar2 = p->pGia;
      lVar7 = 0;
      do {
        if (pGVar2->nTravIdsAlloc <= piVar5[lVar7]) {
          __assert_fail("Id < p->nTravIdsAlloc",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x265,"void Gia_ObjSetTravIdCurrentId(Gia_Man_t *, int)");
        }
        pGVar2->pTravIds[piVar5[lVar7]] = pGVar2->nTravIds;
        lVar7 = lVar7 + 1;
      } while (lVar7 < pVVar1->nSize);
    }
    Gia_ObjSimCollect(p);
    pVVar1 = p->vFanins2;
    if (0 < pVVar1->nSize) {
      pVVar3 = p->vCands;
      lVar7 = 0;
      do {
        Vec_IntPush(pVVar3,pVVar1->pArray[lVar7]);
        lVar7 = lVar7 + 1;
      } while (lVar7 < pVVar1->nSize);
    }
    pVVar3 = p->vFanins;
    pVVar1 = p->vFanins2;
    p->vFanins = pVVar1;
    p->vFanins2 = pVVar3;
    iVar6 = pVVar1->nSize;
  } while( true );
}

Assistant:

Vec_Int_t * Gia_ObjSimCands( Gia_SimRsbMan_t * p, int iObj, int nCands )
{
    assert( iObj > 0 );
    assert( Gia_ObjIsAnd(Gia_ManObj(p->pGia, iObj)) );
    Vec_IntClear( p->vCands );
    Vec_IntFill( p->vFanins, 1, iObj );
    while ( Vec_IntSize(p->vFanins) > 0 && Vec_IntSize(p->vCands) < nCands )
    {
        int i, iTemp;
        Vec_IntForEachEntry( p->vFanins, iTemp, i )
            Gia_ObjSetTravIdCurrentId( p->pGia, iTemp );
        Gia_ObjSimCollect( p ); // p->vFanins -> p->vFanins2
        Vec_IntAppend( p->vCands, p->vFanins2 );
        ABC_SWAP( Vec_Int_t *, p->vFanins, p->vFanins2 );
    }
    assert( Vec_IntSize(p->vFanins) == 0 || Vec_IntSize(p->vCands) >= nCands );
    if ( Vec_IntSize(p->vCands) > nCands )
        Vec_IntShrink( p->vCands, nCands );
    return p->vCands;
}